

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O1

HighsInt __thiscall
free_format_parser::HMpsFF::fillHessian(HMpsFF *this,HighsLogOptions *log_options)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer ptVar4;
  pointer ptVar5;
  pointer piVar6;
  pointer pdVar7;
  _Head_base<1UL,_int,_false> *p_Var8;
  int *piVar9;
  long lVar10;
  size_type __new_size;
  vector<int,_std::allocator<int>_> q_length;
  vector<int,_std::allocator<int>_> local_48;
  value_type_conflict2 local_24;
  
  ptVar4 = (this->q_entries).
           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar5 = (this->q_entries).
           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)ptVar5 - (long)ptVar4 == 0) {
    this->q_dim = 0;
  }
  else {
    __new_size = (long)ptVar5 - (long)ptVar4 >> 4;
    this->q_dim = this->num_col;
    std::vector<int,_std::allocator<int>_>::resize(&this->q_start,(long)this->num_col + 1);
    std::vector<int,_std::allocator<int>_>::resize(&this->q_index,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(&this->q_value,__new_size);
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_24 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_48,(long)this->q_dim,&local_24);
    if (ptVar5 != ptVar4) {
      lVar10 = __new_size + (__new_size == 0);
      p_Var8 = &(((this->q_entries).
                  super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Tuple_impl<0UL,_int,_int,_double>).super__Tuple_impl<1UL,_int,_double>.
                super__Head_base<1UL,_int,_false>;
      do {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[p_Var8->_M_head_impl] =
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[p_Var8->_M_head_impl] + 1;
        p_Var8 = p_Var8 + 4;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    piVar6 = (this->q_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    *piVar6 = 0;
    if (0 < this->num_col) {
      lVar10 = 0;
      do {
        piVar6[lVar10 + 1] =
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar10] + piVar6[lVar10];
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10] = piVar6[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 < this->num_col);
    }
    if (ptVar5 != ptVar4) {
      piVar6 = (this->q_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->q_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = __new_size + (__new_size == 0);
      piVar9 = (int *)&(((this->q_entries).
                         super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Tuple_impl<0UL,_int,_int,_double>).super__Tuple_impl<1UL,_int,_double>
                       .field_0xc;
      do {
        iVar2 = piVar9[-1];
        dVar1 = *(double *)(piVar9 + -3);
        piVar6[local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar2]] = *piVar9;
        iVar3 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2];
        pdVar7[iVar3] = dVar1;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2] = iVar3 + 1;
        piVar9 = piVar9 + 4;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return 0;
}

Assistant:

HighsInt HMpsFF::fillHessian(const HighsLogOptions& log_options) {
  size_t num_entries = q_entries.size();
  if (!num_entries) {
    q_dim = 0;
    return 0;
  } else {
    q_dim = num_col;
  }

  q_start.resize(q_dim + 1);
  q_index.resize(num_entries);
  q_value.resize(num_entries);

  // Use q_length to determine the number of entries in each column,
  // and then as workspace to point to the next entry to be filled in
  // each column
  std::vector<HighsInt> q_length;
  q_length.assign(q_dim, 0);

  for (size_t iEl = 0; iEl < num_entries; iEl++) {
    HighsInt iCol = std::get<1>(q_entries[iEl]);
    q_length[iCol]++;
  }
  q_start[0] = 0;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    q_start[iCol + 1] = q_start[iCol] + q_length[iCol];
    q_length[iCol] = q_start[iCol];
  }

  for (size_t iEl = 0; iEl < num_entries; iEl++) {
    HighsInt iRow = std::get<0>(q_entries[iEl]);
    HighsInt iCol = std::get<1>(q_entries[iEl]);
    double value = std::get<2>(q_entries[iEl]);
    q_index[q_length[iCol]] = iRow;
    q_value[q_length[iCol]] = value;
    q_length[iCol]++;
  }
  return 0;
}